

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckBlockSignature
          (SharedValidator *this,Location *loc,Opcode opcode,Type sig_type,
          TypeVector *out_param_types,TypeVector *out_result_types)

{
  bool bVar1;
  char *pcVar2;
  TypeVector local_e8;
  Enum local_cc;
  Var local_c8;
  Enum local_7c;
  undefined1 local_78 [8];
  FuncType func_type;
  Index sig_index;
  TypeVector *out_result_types_local;
  TypeVector *out_param_types_local;
  Location *loc_local;
  SharedValidator *this_local;
  Type sig_type_local;
  Opcode opcode_local;
  Result result;
  
  this_local = (SharedValidator *)sig_type;
  sig_type_local.enum_ = opcode.enum_;
  Result::Result((Result *)&sig_type_local.type_index_,Ok);
  bVar1 = Type::IsIndex((Type *)&this_local);
  if (bVar1) {
    func_type._52_4_ = Type::GetIndex((Type *)&this_local);
    FuncType::FuncType((FuncType *)local_78);
    Var::Var(&local_c8,func_type._52_4_,loc);
    local_7c = (Enum)CheckFuncTypeIndex(this,&local_c8,(FuncType *)local_78);
    Result::operator|=((Result *)&sig_type_local.type_index_,(Result)local_7c);
    Var::~Var(&local_c8);
    bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_78);
    if (!bVar1) {
      bVar1 = Features::multi_value_enabled((Features *)this);
      if (!bVar1) {
        pcVar2 = Opcode::GetName((Opcode *)&sig_type_local);
        local_cc = (Enum)PrintError(this,loc,"%s params not currently supported.",pcVar2);
        Result::operator|=((Result *)&sig_type_local.type_index_,(Result)local_cc);
      }
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              (out_param_types,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_78);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              (out_result_types,
               (vector<wabt::Type,_std::allocator<wabt::Type>_> *)
               &func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    FuncType::~FuncType((FuncType *)local_78);
  }
  else {
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::clear(out_param_types);
    Type::GetInlineVector(&local_e8,(Type *)&this_local);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=(out_result_types,&local_e8);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_e8);
  }
  return (Result)sig_type_local.type_index_;
}

Assistant:

Result SharedValidator::CheckBlockSignature(const Location& loc,
                                            Opcode opcode,
                                            Type sig_type,
                                            TypeVector* out_param_types,
                                            TypeVector* out_result_types) {
  Result result = Result::Ok;

  if (sig_type.IsIndex()) {
    Index sig_index = sig_type.GetIndex();
    FuncType func_type;
    result |= CheckFuncTypeIndex(Var(sig_index, loc), &func_type);

    if (!func_type.params.empty() && !options_.features.multi_value_enabled()) {
      result |= PrintError(loc, "%s params not currently supported.",
                           opcode.GetName());
    }
    // Multiple results without --enable-multi-value is checked above in
    // OnType.

    *out_param_types = func_type.params;
    *out_result_types = func_type.results;
  } else {
    out_param_types->clear();
    *out_result_types = sig_type.GetInlineVector();
  }

  return result;
}